

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Demiter(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  char *pGen;
  Gia_Man_t *pPart2;
  Gia_Man_t *pPart1;
  char pName1 [1000];
  char local_438 [8];
  char pName0 [1000];
  uint local_44;
  int fVerbose;
  int fDual;
  int fDumpFilesTwo;
  int fDumpFiles;
  int c;
  Gia_Man_t *pTemp;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  bVar1 = false;
  bVar2 = false;
  bVar3 = false;
  local_44 = 0;
  Extra_UtilGetoptReset();
LAB_002c2389:
  iVar4 = Extra_UtilGetopt(argc,argv,"ftdvh");
  if (iVar4 == -1) {
    if (pAbc->pGia == (Gia_Man_t *)0x0) {
      Abc_Print(-1,"Abc_CommandAbc9Demiter(): There is no AIG.\n");
    }
    else if ((bVar1) || (bVar2)) {
      memcpy(local_438,"miter_part0.aig",1000);
      memcpy(&pPart1,"miter_part1.aig",1000);
      iVar4 = Gia_ManPoNum(pAbc->pGia);
      if (iVar4 % 2 == 0) {
        if (bVar2) {
          Gia_ManDemiterTwoWords(pAbc->pGia,&pPart2,(Gia_Man_t **)&pGen);
        }
        else {
          Gia_ManDemiterDual(pAbc->pGia,&pPart2,(Gia_Man_t **)&pGen);
        }
        if (pAbc->pGia->pSpec != (char *)0x0) {
          pcVar5 = Extra_FileNameGeneric(pAbc->pGia->pSpec);
          sprintf(local_438,"%s_1.aig",pcVar5);
          sprintf((char *)&pPart1,"%s_2.aig",pcVar5);
          if (pcVar5 != (char *)0x0) {
            free(pcVar5);
          }
        }
        Gia_AigerWrite(pPart2,local_438,0,0,0);
        Gia_AigerWrite((Gia_Man_t *)pGen,(char *)&pPart1,0,0,0);
        Gia_ManStop(pPart2);
        Gia_ManStop((Gia_Man_t *)pGen);
        if (bVar2) {
          printf("Two parts of the two-word miter are dumped into files \"%s\" and \"%s\".\n",
                 local_438,&pPart1);
        }
        else {
          printf("Two parts of the dual-output miter are dumped into files \"%s\" and \"%s\".\n",
                 local_438,&pPart1);
        }
      }
      else {
        Abc_Print(-1,"Abc_CommandAbc9Demiter(): Does not look like a dual-output miter.\n");
      }
    }
    else {
      iVar4 = Gia_ManPoNum(pAbc->pGia);
      if (iVar4 == 1) {
        if (bVar3) {
          _fDumpFiles = Gia_ManDemiterToDual(pAbc->pGia);
        }
        else {
          _fDumpFiles = Gia_ManDupDemiter(pAbc->pGia,local_44);
        }
        Abc_FrameUpdateGia(pAbc,_fDumpFiles);
        if (local_44 != 0) {
          Gia_ManPrintStatsMiter(_fDumpFiles,0);
        }
      }
      else {
        Abc_Print(-1,"Abc_CommandAbc9Demiter(): Miter should have one output.\n");
      }
    }
    return 0;
  }
  switch(iVar4) {
  case 100:
    bVar3 = (bool)(bVar3 ^ 1);
    goto LAB_002c2389;
  default:
    break;
  case 0x66:
    bVar1 = (bool)(bVar1 ^ 1);
    goto LAB_002c2389;
  case 0x68:
    break;
  case 0x74:
    bVar2 = (bool)(bVar2 ^ 1);
    goto LAB_002c2389;
  case 0x76:
    goto switchD_002c23cd_caseD_76;
  }
  Abc_Print(-2,"usage: &demiter [-ftdvh]\n");
  Abc_Print(-2,"\t         decomposes a miter (by default, tries to extract an OR gate)\n");
  pcVar5 = "no";
  if (bVar1) {
    pcVar5 = "yes";
  }
  Abc_Print(-2,"\t-f     : write files with two sides of a dual-output miter [default = %s]\n",
            pcVar5);
  pcVar5 = "no";
  if (bVar2) {
    pcVar5 = "yes";
  }
  Abc_Print(-2,"\t-t     : write files with two sides of a two-word miter [default = %s]\n",pcVar5);
  pcVar5 = "no";
  if (bVar3) {
    pcVar5 = "yes";
  }
  Abc_Print(-2,"\t-d     : take single-output and decompose into dual-output [default = %s]\n",
            pcVar5);
  pcVar5 = "no";
  if (local_44 != 0) {
    pcVar5 = "yes";
  }
  Abc_Print(-2,"\t-v     : toggles printing verbose information [default = %s]\n",pcVar5);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
switchD_002c23cd_caseD_76:
  local_44 = local_44 ^ 1;
  goto LAB_002c2389;
}

Assistant:

int Abc_CommandAbc9Demiter( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_Man_t * pTemp;
    int c, fDumpFiles = 0, fDumpFilesTwo = 0, fDual = 0, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "ftdvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'f':
            fDumpFiles ^= 1;
            break;
        case 't':
            fDumpFilesTwo ^= 1;
            break;
        case 'd':
            fDual ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Demiter(): There is no AIG.\n" );
        return 0;
    }
    if ( fDumpFiles || fDumpFilesTwo )
    {
        char pName0[1000] = "miter_part0.aig";
        char pName1[1000] = "miter_part1.aig";
        Gia_Man_t * pPart1, * pPart2;
        if ( Gia_ManPoNum(pAbc->pGia) % 2 != 0 )
        {
            Abc_Print( -1, "Abc_CommandAbc9Demiter(): Does not look like a dual-output miter.\n" );
            return 0;
        }
        if ( fDumpFilesTwo )
            Gia_ManDemiterTwoWords( pAbc->pGia, &pPart1, &pPart2 );
        else
            Gia_ManDemiterDual( pAbc->pGia, &pPart1, &pPart2 );
        if ( pAbc->pGia->pSpec )
        {
            char * pGen = Extra_FileNameGeneric(pAbc->pGia->pSpec);
            sprintf( pName0, "%s_1.aig", pGen );
            sprintf( pName1, "%s_2.aig", pGen );
            ABC_FREE( pGen );
        }
        Gia_AigerWrite( pPart1, pName0, 0, 0, 0 );
        Gia_AigerWrite( pPart2, pName1, 0, 0, 0 );
        Gia_ManStop( pPart1 );
        Gia_ManStop( pPart2 );
        if ( fDumpFilesTwo )
            printf( "Two parts of the two-word miter are dumped into files \"%s\" and \"%s\".\n", pName0, pName1 );
        else
            printf( "Two parts of the dual-output miter are dumped into files \"%s\" and \"%s\".\n", pName0, pName1 );
        return 0;
    }
    if ( Gia_ManPoNum(pAbc->pGia) != 1 )
    {
        Abc_Print( -1, "Abc_CommandAbc9Demiter(): Miter should have one output.\n" );
        return 0;
    }
    if ( fDual )
        pTemp = Gia_ManDemiterToDual( pAbc->pGia );
    else
        pTemp = Gia_ManDupDemiter( pAbc->pGia, fVerbose );
    Abc_FrameUpdateGia( pAbc, pTemp );
    if ( fVerbose )
        Gia_ManPrintStatsMiter( pTemp, 0 );
    return 0;

usage:
    Abc_Print( -2, "usage: &demiter [-ftdvh]\n" );
    Abc_Print( -2, "\t         decomposes a miter (by default, tries to extract an OR gate)\n" );
    Abc_Print( -2, "\t-f     : write files with two sides of a dual-output miter [default = %s]\n",  fDumpFiles? "yes": "no" );
    Abc_Print( -2, "\t-t     : write files with two sides of a two-word miter [default = %s]\n",  fDumpFilesTwo? "yes": "no" );
    Abc_Print( -2, "\t-d     : take single-output and decompose into dual-output [default = %s]\n",  fDual? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggles printing verbose information [default = %s]\n",  fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}